

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O2

int __thiscall
Parse::TPTP::addPredicate(TPTP *this,string *name,int arity,bool *added,TermList *arg)

{
  bool bVar1;
  uint uVar2;
  TermList TVar3;
  TermList TVar4;
  UserErrorException *this_00;
  string *this_01;
  TermList *added_00;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  added_00 = arg;
  bVar1 = std::operator==(name,"$evaleq");
  uVar2 = 0xffffffff;
  if ((!bVar1) && (bVar1 = std::operator==(name,"$equal"), !bVar1)) {
    bVar1 = std::operator==(name,"$less");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_50,(string *)name);
      uVar2 = addOverloadedPredicate
                        (this,&local_50,arity,2,(bool *)added_00,arg,INT_LESS,RAT_LESS,REAL_LESS);
      this_01 = &local_50;
    }
    else {
      bVar1 = std::operator==(name,"$lesseq");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_70,(string *)name);
        uVar2 = addOverloadedPredicate
                          (this,&local_70,arity,2,(bool *)added_00,arg,INT_LESS_EQUAL,RAT_LESS_EQUAL
                           ,REAL_LESS_EQUAL);
        this_01 = &local_70;
      }
      else {
        bVar1 = std::operator==(name,"$greater");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_90,(string *)name);
          uVar2 = addOverloadedPredicate
                            (this,&local_90,arity,2,(bool *)added_00,arg,INT_GREATER,RAT_GREATER,
                             REAL_GREATER);
          this_01 = &local_90;
        }
        else {
          bVar1 = std::operator==(name,"$greatereq");
          if (bVar1) {
            std::__cxx11::string::string((string *)&local_b0,(string *)name);
            uVar2 = addOverloadedPredicate
                              (this,&local_b0,arity,2,(bool *)added_00,arg,INT_GREATER_EQUAL,
                               RAT_GREATER_EQUAL,REAL_GREATER_EQUAL);
            this_01 = &local_b0;
          }
          else {
            bVar1 = std::operator==(name,"$is_int");
            if (bVar1) {
              std::__cxx11::string::string((string *)&local_d0,(string *)name);
              uVar2 = addOverloadedPredicate
                                (this,&local_d0,arity,1,(bool *)added_00,arg,INT_IS_INT,RAT_IS_INT,
                                 REAL_IS_INT);
              this_01 = &local_d0;
            }
            else {
              bVar1 = std::operator==(name,"$divides");
              if (bVar1) {
                TVar3 = sortOf(this,arg->_content);
                TVar4 = Kernel::AtomicSort::intSort();
                if (TVar3._content != TVar4._content) {
                  this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
                  Lib::UserErrorException::Exception
                            (this_00,"$divides can only be used with integer type");
                  __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
                              Lib::UserErrorException::~UserErrorException);
                }
                std::__cxx11::string::string((string *)&local_f0,(string *)name);
                uVar2 = addOverloadedPredicate
                                  (this,&local_f0,arity,2,(bool *)added_00,arg,INT_DIVIDES,
                                   INT_DIVIDES,INT_DIVIDES);
                this_01 = &local_f0;
              }
              else {
                bVar1 = std::operator==(name,"$is_rat");
                if (!bVar1) {
                  bVar1 = std::operator==(name,"$distinct");
                  if (bVar1) {
                    return -2;
                  }
                  uVar2 = Kernel::Signature::addPredicate(DAT_00a14190,name,arity,added);
                  return uVar2;
                }
                std::__cxx11::string::string((string *)&local_110,(string *)name);
                uVar2 = addOverloadedPredicate
                                  (this,&local_110,arity,1,(bool *)added_00,arg,INT_IS_RAT,
                                   RAT_IS_RAT,REAL_IS_RAT);
                this_01 = &local_110;
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)this_01);
  }
  return uVar2;
}

Assistant:

int TPTP::addPredicate(std::string name,int arity,bool& added,TermList& arg)
{
  if (name == "$evaleq" || name == "$equal") {
    return -1;
  }
  if (name == "$less") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_LESS,
				  Theory::RAT_LESS,
				  Theory::REAL_LESS);
  }
  if (name == "$lesseq") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_LESS_EQUAL,
				  Theory::RAT_LESS_EQUAL,
				  Theory::REAL_LESS_EQUAL);
  }
  if (name == "$greater") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_GREATER,
				  Theory::RAT_GREATER,
				  Theory::REAL_GREATER);
  }
  if (name == "$greatereq") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_GREATER_EQUAL,
				  Theory::RAT_GREATER_EQUAL,
				  Theory::REAL_GREATER_EQUAL);
  }
  if (name == "$is_int") {
    return addOverloadedPredicate(name,arity,1,added,arg,
				  Theory::INT_IS_INT,
				  Theory::RAT_IS_INT,
				  Theory::REAL_IS_INT);
  }
  if (name == "$divides"){
    if(sortOf(arg)!=AtomicSort::intSort()){
      USER_ERROR("$divides can only be used with integer type");
    }
    return addOverloadedPredicate(name,arity,2,added,arg,
                                  Theory::INT_DIVIDES,
                                  Theory::INT_DIVIDES,  // will not be used
                                  Theory::INT_DIVIDES); // will not be used
  }
  if (name == "$is_rat") {
    return addOverloadedPredicate(name,arity,1,added,arg,
				  Theory::INT_IS_RAT,
				  Theory::RAT_IS_RAT,
				  Theory::REAL_IS_RAT);
  } 
  if(name == "$distinct"){
    // special case for distinct, dealt with in formulaInfix
    return -2;
  }
  return env.signature->addPredicate(name,arity,added);
}